

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configurator.hpp
# Opt level: O3

void __thiscall Configurator::Configurator(Configurator *this,streambuf *out_buf)

{
  (this->configuration)._M_dataplus._M_p = (pointer)&(this->configuration).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
  std::ostream::ostream(&this->output,out_buf);
  return;
}

Assistant:

explicit Configurator(std::streambuf* out_buf) : output(out_buf) {}